

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O3

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  SeparatedSyntaxList<slang::syntax::DistItemBaseSyntax> *args_2;
  DistConstraintListSyntax *pDVar1;
  Token local_58;
  Token local_48;
  Token local_38;
  
  local_38 = parsing::Token::deepClone((Token *)(__fn + 0x18),(BumpAllocator *)__child_stack);
  local_48 = parsing::Token::deepClone((Token *)(__fn + 0x28),(BumpAllocator *)__child_stack);
  args_2 = deepClone<slang::syntax::DistItemBaseSyntax>
                     ((SeparatedSyntaxList<slang::syntax::DistItemBaseSyntax> *)(__fn + 0x38),
                      (BumpAllocator *)__child_stack);
  local_58 = parsing::Token::deepClone((Token *)(__fn + 0x70),(BumpAllocator *)__child_stack);
  pDVar1 = BumpAllocator::
           emplace<slang::syntax::DistConstraintListSyntax,slang::parsing::Token,slang::parsing::Token,slang::syntax::SeparatedSyntaxList<slang::syntax::DistItemBaseSyntax>&,slang::parsing::Token>
                     ((BumpAllocator *)__child_stack,&local_38,&local_48,args_2,&local_58);
  return (int)pDVar1;
}

Assistant:

static SyntaxNode* clone(const DistConstraintListSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<DistConstraintListSyntax>(
        node.dist.deepClone(alloc),
        node.openBrace.deepClone(alloc),
        *deepClone(node.items, alloc),
        node.closeBrace.deepClone(alloc)
    );
}